

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

int __thiscall OpenMD::EAMAdapter::getNrho(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  FuncflParameters local_90;
  
  getFuncflParam(&local_90,this);
  FuncflParameters::~FuncflParameters(&local_90);
  return local_90.nrho;
}

Assistant:

int EAMAdapter::getNrho() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.nrho;
  }